

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

TestCase *
deqp::gles31::Functional::anon_unknown_0::createDiffTest
          (Context *context,PrePost prepost,char *name,BlendState *commonState,
          BlendState *drawBufferState)

{
  bool *pbVar1;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *pEVar2;
  BlendFunc *pBVar3;
  undefined8 uVar4;
  DrawBuffersIndexedTest *this;
  undefined1 uVar5;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *this_00;
  allocator<char> local_1e9;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  drawBuffers_1;
  Maybe<tcu::Vector<bool,_4>_> local_1b0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [112];
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  BlendState preState;
  BlendState emptyState;
  
  local_120._0_4_ = 0;
  local_120._4_4_ = 0;
  preState.enableBlend.m_ptr = (bool *)0x0;
  local_1a0._0_8_ =
       (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
        *)0x0;
  drawBuffers.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  BlendState::BlendState
            (&emptyState,(Maybe<bool> *)local_120,
             (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
              *)&preState,
             (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              *)local_1a0,(Maybe<tcu::Vector<bool,_4>_> *)&drawBuffers);
  if (prepost == PRE) {
    pbVar1 = (commonState->enableBlend).m_ptr;
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&drawBuffers.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 == (bool *)0x0) {
      uVar5 = 1;
    }
    else {
      uVar5 = *pbVar1;
    }
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(drawBuffers.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,uVar5);
    pEVar2 = (commonState->blendFunc).m_ptr;
    if (pEVar2 == (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                   *)0x0) {
      local_120._8_8_ = &local_110;
      local_120[0] = 1;
      local_110._M_allocated_capacity = (size_type)&DAT_100000001;
      local_1a0[8] = '\x01';
      local_190._8_8_ = &DAT_100000001;
    }
    else {
      local_1a0[8] = pEVar2->m_isFirst;
      pBVar3 = (pEVar2->field_1).m_first;
      if ((bool)local_1a0[8] == true) {
        local_190._8_8_ = *pBVar3;
      }
      else {
        local_190._8_8_ = *pBVar3;
        local_190._16_8_ = pBVar3[1];
      }
    }
    local_190._0_8_ = local_190 + 8;
    local_1a0._0_8_ = local_1a0 + 8;
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    BlendState::BlendState
              (&preState,(Maybe<bool> *)&drawBuffers,&commonState->blendEq,
               (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
                *)local_1a0,(Maybe<tcu::Vector<bool,_4>_> *)&drawBuffers_1);
    uVar4 = local_1a0._0_8_;
    if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)local_1a0._0_8_ !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      *(char *)local_1a0._0_8_ = '\x01';
      ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
        *)(uVar4 + 8))->m_first = (BlendFunc *)0x0;
    }
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000000040;
    local_1b0.m_ptr = (Vector<bool,_4> *)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_1a0,true,(IVec2 *)&drawBuffers,&emptyState,
               (TextureFormat *)&local_1b0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&drawBuffers_1,(value_type *)local_1a0);
    BlendState::~BlendState((BlendState *)(local_190 + 8));
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000000040;
    local_1b0.m_ptr = (Vector<bool,_4> *)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_1a0,true,(IVec2 *)&drawBuffers,drawBufferState,
               (TextureFormat *)&local_1b0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&drawBuffers_1,(value_type *)local_1a0);
    BlendState::~BlendState((BlendState *)(local_190 + 8));
    this = (DrawBuffersIndexedTest *)operator_new(0x160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,name,(allocator<char> *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&drawBuffers,name,&local_1e9);
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              (this,context,&preState,&emptyState,&drawBuffers_1,(string *)local_1a0,
               (string *)&drawBuffers);
    std::__cxx11::string::~string((string *)&drawBuffers);
    std::__cxx11::string::~string((string *)local_1a0);
    this_00 = &drawBuffers_1;
  }
  else {
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&drawBuffers_1.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    local_120._0_4_ = 0;
    local_120._4_4_ = 0;
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(drawBuffers_1.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&drawBuffers.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(drawBuffers.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_100000001;
    local_1a0._0_8_ = local_1a0 + 8;
    local_1a0[8] = '\x01';
    local_190._0_8_ = local_190 + 8;
    local_190._8_8_ = &DAT_100000001;
    local_1b0.m_ptr = (Vector<bool,_4> *)0x0;
    BlendState::BlendState
              (&preState,(Maybe<bool> *)&drawBuffers_1,
               (Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
                *)local_120,
               (Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
                *)local_1a0,&local_1b0);
    uVar4 = local_1a0._0_8_;
    if ((Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)local_1a0._0_8_ !=
        (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
         *)0x0) {
      *(char *)local_1a0._0_8_ = '\x01';
      ((anon_union_8_2_067f4667_for_Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_3
        *)(uVar4 + 8))->m_first = (BlendFunc *)0x0;
    }
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    drawBuffers.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_120._0_4_ = 0x40;
    local_120._4_4_ = 0x40;
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_1a0,true,(IVec2 *)local_120,&emptyState,
               (TextureFormat *)&drawBuffers_1);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&drawBuffers,(value_type *)local_1a0);
    BlendState::~BlendState((BlendState *)(local_190 + 8));
    local_120._0_4_ = 0x40;
    local_120._4_4_ = 0x40;
    drawBuffers_1.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000008;
    DrawBufferInfo::DrawBufferInfo
              ((DrawBufferInfo *)local_1a0,true,(IVec2 *)local_120,drawBufferState,
               (TextureFormat *)&drawBuffers_1);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(&drawBuffers,(value_type *)local_1a0);
    BlendState::~BlendState((BlendState *)(local_190 + 8));
    this = (DrawBuffersIndexedTest *)operator_new(0x160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,name,(allocator<char> *)&drawBuffers_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,name,(allocator<char> *)&local_1b0);
    DrawBuffersIndexedTest::DrawBuffersIndexedTest
              (this,context,&preState,commonState,&drawBuffers,(string *)local_1a0,
               (string *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_1a0);
    this_00 = &drawBuffers;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  ::~vector(this_00);
  BlendState::~BlendState(&preState);
  BlendState::~BlendState(&emptyState);
  return &this->super_TestCase;
}

Assistant:

TestCase* createDiffTest (Context& context, PrePost prepost, const char* name, const BlendState& commonState, const BlendState& drawBufferState)
{
	const BlendState emptyState = BlendState(tcu::nothing<bool>(), tcu::nothing<Either<BlendEq, SeparateBlendEq> >(), tcu::nothing<Either<BlendFunc, SeparateBlendFunc> >(), tcu::nothing<BVec4>());

	if (prepost == PRE)
	{
		const BlendState		preState	= BlendState((commonState.enableBlend ? commonState.enableBlend : just(true)),
														 commonState.blendEq,
														 (commonState.blendFunc ? commonState.blendFunc : just(Either<BlendFunc, SeparateBlendFunc>(BlendFunc(GL_ONE, GL_ONE)))),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), emptyState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));
		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, emptyState, drawBuffers, name, name);
	}
	else if (prepost == POST)
	{
		const BlendState		preState	= BlendState(just(true),
														 tcu::nothing<Either<BlendEq, SeparateBlendEq> >(),
														 Maybe<Either<BlendFunc, SeparateBlendFunc> >(BlendFunc(GL_ONE, GL_ONE)),
														 tcu::nothing<BVec4>());
		vector<DrawBufferInfo>	drawBuffers;

		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), emptyState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));
		drawBuffers.push_back(DrawBufferInfo(true, IVec2(64, 64), drawBufferState, TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)));

		return new DrawBuffersIndexedTest(context, preState, commonState, drawBuffers, name, name);
	}
	else
	{
		DE_ASSERT(false);
		return DE_NULL;
	}
}